

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<baryonyx::objective_function_type> read_objective_type(string_view token)

{
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view lhs_02;
  string_view lhs_03;
  string_view lhs_04;
  bool bVar1;
  objective_function_type local_ec;
  string_view local_e8;
  size_t local_d8;
  char *local_d0;
  string_view local_c8;
  size_t local_b8;
  char *local_b0;
  string_view local_a8;
  size_t local_98;
  char *local_90;
  objective_function_type local_84;
  string_view local_80;
  size_t local_70;
  char *local_68;
  string_view local_60;
  size_t local_50;
  char *local_48;
  string_view local_40;
  size_t local_30;
  char *local_28;
  size_t local_20;
  string_view token_local;
  
  local_28 = token._M_str;
  local_30 = token._M_len;
  local_20 = local_30;
  token_local._M_len = (size_t)local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"maximize");
  lhs_04._M_str = local_28;
  lhs_04._M_len = local_30;
  bVar1 = are_equal(lhs_04,local_40);
  if (!bVar1) {
    local_50 = local_20;
    local_48 = (char *)token_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"maximum");
    lhs_03._M_str = local_48;
    lhs_03._M_len = local_50;
    bVar1 = are_equal(lhs_03,local_60);
    if (!bVar1) {
      local_70 = local_20;
      local_68 = (char *)token_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"max");
      lhs_02._M_str = local_68;
      lhs_02._M_len = local_70;
      bVar1 = are_equal(lhs_02,local_80);
      if (!bVar1) {
        local_98 = local_20;
        local_90 = (char *)token_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"minimize");
        lhs_01._M_str = local_90;
        lhs_01._M_len = local_98;
        bVar1 = are_equal(lhs_01,local_a8);
        if (!bVar1) {
          local_b8 = local_20;
          local_b0 = (char *)token_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c8,"minimum");
          lhs_00._M_str = local_b0;
          lhs_00._M_len = local_b8;
          bVar1 = are_equal(lhs_00,local_c8);
          if (!bVar1) {
            local_d8 = local_20;
            local_d0 = (char *)token_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e8,"min");
            lhs._M_str = local_d0;
            lhs._M_len = local_d8;
            bVar1 = are_equal(lhs,local_e8);
            if (!bVar1) {
              std::optional<baryonyx::objective_function_type>::optional
                        ((optional<baryonyx::objective_function_type> *)&token_local._M_str);
              return (_Optional_base<baryonyx::objective_function_type,_true,_true>)
                     (_Optional_base<baryonyx::objective_function_type,_true,_true>)
                     token_local._M_str;
            }
          }
        }
        local_ec = minimize;
        std::optional<baryonyx::objective_function_type>::
        optional<baryonyx::objective_function_type,_true>
                  ((optional<baryonyx::objective_function_type> *)&token_local._M_str,&local_ec);
        return (_Optional_base<baryonyx::objective_function_type,_true,_true>)
               (_Optional_base<baryonyx::objective_function_type,_true,_true>)token_local._M_str;
      }
    }
  }
  local_84 = maximize;
  std::optional<baryonyx::objective_function_type>::
  optional<baryonyx::objective_function_type,_true>
            ((optional<baryonyx::objective_function_type> *)&token_local._M_str,&local_84);
  return (_Optional_base<baryonyx::objective_function_type,_true,_true>)
         (_Optional_base<baryonyx::objective_function_type,_true,_true>)token_local._M_str;
}

Assistant:

std::optional<baryonyx::objective_function_type>
read_objective_type(const std::string_view token) noexcept
{
    if (are_equal(token, "maximize") || are_equal(token, "maximum") ||
        are_equal(token, "max"))
        return baryonyx::objective_function_type::maximize;

    if (are_equal(token, "minimize") || are_equal(token, "minimum") ||
        are_equal(token, "min"))
        return baryonyx::objective_function_type::minimize;

    return std::nullopt;
}